

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::cmState(cmState *this,Mode mode,ProjectKind projectKind)

{
  unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>
  local_38 [3];
  unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_> local_20;
  ProjectKind local_18;
  Mode local_14;
  ProjectKind projectKind_local;
  Mode mode_local;
  cmState *this_local;
  
  local_18 = projectKind;
  local_14 = mode;
  _projectKind_local = this;
  cmPropertyDefinitionMap::cmPropertyDefinitionMap(&this->PropertyDefinitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->EnabledLanguages);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
  ::unordered_map(&this->BuiltinCommands);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
  ::unordered_map(&this->ScriptedCommands);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->FlowControlCommands);
  cmPropertyMap::cmPropertyMap(&this->GlobalProperties);
  std::unique_ptr<cmCacheManager,std::default_delete<cmCacheManager>>::
  unique_ptr<std::default_delete<cmCacheManager>,void>
            ((unique_ptr<cmCacheManager,std::default_delete<cmCacheManager>> *)&this->CacheManager);
  std::unique_ptr<cmGlobVerificationManager,std::default_delete<cmGlobVerificationManager>>::
  unique_ptr<std::default_delete<cmGlobVerificationManager>,void>
            ((unique_ptr<cmGlobVerificationManager,std::default_delete<cmGlobVerificationManager>> *
             )&this->GlobVerificationManager);
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::cmLinkedTree
            (&this->BuildsystemDirectory);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<cmStateDetail::SnapshotDataType>::cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmDefinitions>::cmLinkedTree(&this->VarTree);
  std::__cxx11::string::string((string *)&this->SourceDirectory);
  std::__cxx11::string::string((string *)&this->BinaryDirectory);
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this->NinjaMulti = false;
  this->StateMode = local_14;
  this->StateProjectKind = local_18;
  std::optional<cmDependencyProvider>::optional(&this->DependencyProvider);
  this->ProcessingTopLevelIncludes = false;
  std::make_unique<cmCacheManager>();
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::operator=
            (&this->CacheManager,&local_20);
  std::unique_ptr<cmCacheManager,_std::default_delete<cmCacheManager>_>::~unique_ptr(&local_20);
  std::make_unique<cmGlobVerificationManager>();
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  operator=(&this->GlobVerificationManager,local_38);
  std::unique_ptr<cmGlobVerificationManager,_std::default_delete<cmGlobVerificationManager>_>::
  ~unique_ptr(local_38);
  return;
}

Assistant:

cmState::cmState(Mode mode, ProjectKind projectKind)
  : StateMode(mode)
  , StateProjectKind(projectKind)
{
  this->CacheManager = cm::make_unique<cmCacheManager>();
  this->GlobVerificationManager = cm::make_unique<cmGlobVerificationManager>();
}